

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotator.h
# Opt level: O0

Matrix<60,_60> __thiscall
singular::Rotator::applyFromRightTo<60,60>(Rotator *this,Matrix<60,_60> *lhs,int k)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int in_ECX;
  undefined4 in_register_00000014;
  Matrix<60,_60> *this_00;
  void *in_R8;
  double dVar4;
  double dVar5;
  double x2;
  double x1;
  int i;
  int k_local;
  Matrix<60,_60> *lhs_local;
  Rotator *this_local;
  Matrix<60,_60> *m;
  
  this_00 = (Matrix<60,_60> *)CONCAT44(in_register_00000014,k);
  if (0x3c < in_ECX + 2) {
    __assert_fail("N >= k + 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Rotator.h"
                  ,0xa6,
                  "Matrix<M, N> singular::Rotator::applyFromRightTo(const Matrix<M, N> &, int) [M = 60, N = 60]"
                 );
  }
  Matrix<60,_60>::clone((Matrix<60,_60> *)this,(__fn *)this_00,this_00,in_ECX + 2,in_R8);
  for (x1._4_4_ = 0; x1._4_4_ < 0x3c; x1._4_4_ = x1._4_4_ + 1) {
    dVar4 = Matrix<60,_60>::operator()(this_00,x1._4_4_,in_ECX);
    dVar5 = Matrix<60,_60>::operator()(this_00,x1._4_4_,in_ECX + 1);
    pdVar1 = lhs->pBlock;
    pdVar2 = lhs[2].pBlock;
    pdVar3 = Matrix<60,_60>::operator()((Matrix<60,_60> *)this,x1._4_4_,in_ECX);
    *pdVar3 = dVar4 * (double)pdVar1 + dVar5 * (double)pdVar2;
    pdVar1 = lhs[1].pBlock;
    pdVar2 = lhs[3].pBlock;
    pdVar3 = Matrix<60,_60>::operator()((Matrix<60,_60> *)this,x1._4_4_,in_ECX + 1);
    *pdVar3 = dVar4 * (double)pdVar1 + dVar5 * (double)pdVar2;
  }
  return (Matrix<60,_60>)this->elements;
}

Assistant:

Matrix< M, N > applyFromRightTo(const Matrix< M, N >& lhs, int k) {
			assert(N >= k + 2);
			Matrix< M, N > m = lhs.clone();
			for (int i = 0; i < M; ++i) {
				double x1 = lhs(i, k);
				double x2 = lhs(i, k + 1);
				m(i, k) = x1 * this->elements[0] + x2 * this->elements[2];
				m(i, k + 1) = x1 * this->elements[1] + x2 * this->elements[3];
			}
			return m;
		}